

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O2

void printNodes(vector<TSNode,_std::allocator<TSNode>_> *nodes)

{
  undefined8 *puVar1;
  pointer paVar2;
  pointer paVar3;
  TSNode *pTVar4;
  TSNode self;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  
  std::operator<<((ostream *)&std::cerr,"Nodes at cursor: ");
  paVar2 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar3 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar2 == paVar3) {
    poVar6 = (ostream *)&std::cerr;
    pcVar5 = "No nodes at cursor\n";
  }
  else {
    lVar7 = (long)paVar3 - (long)paVar2;
    lVar8 = lVar7 >> 5;
    while( true ) {
      lVar8 = lVar8 + -1;
      pTVar4 = (TSNode *)
               (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (lVar8 == 0) break;
      puVar1 = (undefined8 *)((long)pTVar4[-1].context + lVar7 + 0x10);
      self.id = (void *)*puVar1;
      self.context = (uint32_t  [4])*(undefined1 (*) [16])((long)pTVar4[-1].context + lVar7);
      self.tree = (TSTree *)puVar1[1];
      pcVar5 = ts_node_type(self);
      poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
      std::operator<<(poVar6," -> ");
      lVar7 = lVar7 + -0x20;
    }
    pcVar5 = ts_node_type(*pTVar4);
    poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
    pcVar5 = "\n";
  }
  std::operator<<(poVar6,pcVar5);
  return;
}

Assistant:

void printNodes (vector<TSNode> &nodes) {
    std::cerr << "Nodes at cursor: ";

    if (nodes.empty()) {
        std::cerr << "No nodes at cursor\n";
        return;
    }

    for (auto i = nodes.size() - 1; i > 0; i--) {
        std::cerr << ts_node_type(nodes[i]) << " -> ";
    }

    std::cerr << ts_node_type(nodes[0]) << "\n";
}